

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

int __thiscall
glslang::TDefaultIoResolverBase::getFreeSlot(TDefaultIoResolverBase *this,int set,int base,int size)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  iterator at;
  int local_20;
  int size_local;
  int base_local;
  int set_local;
  TDefaultIoResolverBase *this_local;
  
  at._M_current._4_4_ = size;
  size_local = set;
  _base_local = this;
  local_30._M_current = (int *)findSlot(this,set,base);
  pmVar2 = std::
           unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](&this->slots,&size_local);
  local_38._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pmVar2);
  bVar1 = __gnu_cxx::operator==(&local_30,&local_38);
  local_20 = base;
  if (bVar1) {
    this_local._4_4_ = reserveSlot(this,size_local,base,at._M_current._4_4_);
  }
  else {
    while( true ) {
      pmVar2 = std::
               unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->slots,&size_local);
      local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pmVar2);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
      if ((!bVar1) ||
         (piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_30), at._M_current._4_4_ <= *piVar3 - local_20)) break;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_30);
      local_20 = *piVar3 + 1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
    this_local._4_4_ = reserveSlot(this,size_local,local_20,at._M_current._4_4_);
  }
  return this_local._4_4_;
}

Assistant:

int TDefaultIoResolverBase::getFreeSlot(int set, int base, int size) {
    TSlotSet::iterator at = findSlot(set, base);
    if (at == slots[set].end())
        return reserveSlot(set, base, size);
    // look for a big enough gap
    for (; at != slots[set].end(); ++at) {
        if (*at - base >= size)
            break;
        base = *at + 1;
    }
    return reserveSlot(set, base, size);
}